

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

sexp_conflict sexp_add_import_binding(sexp_conflict ctx,sexp_conflict env)

{
  sexp psVar1;
  sexp_conflict tmp;
  sexp_conflict sym;
  sexp_conflict local_48;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_48;
  local_38.var = &local_40;
  local_40 = (sexp_conflict)0x43e;
  local_48 = (sexp_conflict)0x43e;
  local_28.next = &local_38;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_40 = (sexp_conflict)sexp_intern(ctx,"repl-import",0xffffffffffffffff);
  psVar1 = (((ctx->value).type.setters)->value).context.dl;
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x17)) {
    psVar1 = (ctx->value).type.cpl;
  }
  local_48 = (sexp_conflict)sexp_env_ref(ctx,psVar1,local_40,0x43e);
  local_40 = (sexp_conflict)sexp_intern(ctx,"import",0xffffffffffffffff);
  sexp_env_define(ctx,env,local_40,local_48);
  (ctx->value).context.saves = local_38.next;
  return env;
}

Assistant:

static sexp sexp_add_import_binding (sexp ctx, sexp env) {
  sexp_gc_var2(sym, tmp);
  sexp_gc_preserve2(ctx, sym, tmp);
  sym = sexp_intern(ctx, "repl-import", -1);
  tmp = sexp_env_ref(ctx, sexp_meta_env(ctx), sym, SEXP_VOID);
  sym = sexp_intern(ctx, "import", -1);
  sexp_env_define(ctx, env, sym, tmp);
  sexp_gc_release2(ctx);
  return env;
}